

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteInitExpr(WatWriter *this,ExprList *expr)

{
  bool bVar1;
  ExprList *expr_local;
  WatWriter *this_local;
  
  bVar1 = intrusive_list<wabt::Expr>::empty(expr);
  if (!bVar1) {
    WritePuts(this,"(",None);
    WriteExprList(this,expr);
    this->next_char_ = None;
    WritePuts(this,")",Space);
  }
  return;
}

Assistant:

void WatWriter::WriteInitExpr(const ExprList& expr) {
  if (!expr.empty()) {
    WritePuts("(", NextChar::None);
    WriteExprList(expr);
    /* clear the next char, so we don't write a newline after the expr */
    next_char_ = NextChar::None;
    WritePuts(")", NextChar::Space);
  }
}